

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpNotify(UpnpDevice_Handle Hnd,char *DevID_const,char *ServName_const,char **VarName_const,
              char **NewVal_const,int cVariables)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  int line;
  char *file;
  Handle_Info *pHStack_38;
  
  line = (int)&pHStack_38;
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa3d,"Inside UpnpNotify\n");
    HandleReadLock((char *)0xa3f,iVar2);
    UVar1 = GetHandleInfo(Hnd,&pHStack_38);
    if (UVar1 == HND_DEVICE) {
      if (DevID_const == (char *)0x0) {
        file = (char *)0xa48;
      }
      else if (ServName_const == (char *)0x0) {
        file = (char *)0xa4c;
      }
      else {
        if ((NewVal_const != (char **)0x0 && VarName_const != (char **)0x0) && -1 < cVariables) {
          HandleUnlock((char *)0xa54,line);
          iVar2 = genaNotifyAll(Hnd,DevID_const,ServName_const,VarName_const,NewVal_const,cVariables
                               );
          UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa58,"Exiting UpnpNotify\n");
          return iVar2;
        }
        file = (char *)0xa50;
      }
      HandleUnlock(file,line);
      iVar2 = -0x65;
    }
    else {
      HandleUnlock((char *)0xa44,line);
      iVar2 = -100;
    }
  }
  return iVar2;
}

Assistant:

int UpnpNotify(UpnpDevice_Handle Hnd,
	const char *DevID_const,
	const char *ServName_const,
	const char **VarName_const,
	const char **NewVal_const,
	int cVariables)
{
	struct Handle_Info *SInfo = NULL;
	int retVal;
	char *DevID = (char *)DevID_const;
	char *ServName = (char *)ServName_const;
	char **VarName = (char **)VarName_const;
	char **NewVal = (char **)NewVal_const;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpNotify\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (DevID == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (ServName == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (VarName == NULL || NewVal == NULL || cVariables < 0) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}

	HandleUnlock(__FILE__, __LINE__);
	retVal = genaNotifyAll(
		Hnd, DevID, ServName, VarName, NewVal, cVariables);

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Exiting UpnpNotify\n");

	return retVal;
}